

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O2

void anon_unknown.dwarf_31cd7f::_set_addString(USet *set,UChar *str,int32_t length)

{
  ConstChar16Ptr local_60 [3];
  UnicodeString local_48;
  
  local_60[0].p_ = str;
  icu_63::UnicodeString::UnicodeString(&local_48,(byte)((uint)length >> 0x1f),local_60,length);
  icu_63::UnicodeSet::add((UnicodeSet *)set,&local_48);
  icu_63::UnicodeString::~UnicodeString(&local_48);
  return;
}

Assistant:

void U_CALLCONV
_set_addString(USet *set, const UChar *str, int32_t length) {
    ((UnicodeSet *)set)->add(icu::UnicodeString((UBool)(length<0), str, length));
}